

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O2

int getmbi(_func_int_void_ptr *getin,void *in)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = (*getin)(in);
    if ((int)uVar1 < 0) {
      return -1;
    }
    uVar2 = uVar2 << 7 | uVar1 & 0x7f;
  } while ((char)uVar1 < '\0');
  return uVar2;
}

Assistant:

int getmbi(int (*getin) (void *in), void *in)
{
	int i, mbi = 0;

	do {
		i = getin(in);
		if(i < 0) {
			return (-1);
		}
		mbi = (mbi << 7) | (i & 0x7f);
	} while(i & 0x80);

	return mbi;
}